

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBuilderBeam.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChBuilderBeamIGA::BuildBeam
          (ChBuilderBeamIGA *this,shared_ptr<chrono::fea::ChMesh> *mesh,
          shared_ptr<chrono::fea::ChBeamSectionCosserat> *sect,int N,ChVector<double> *A,
          ChVector<double> *B,ChVector<double> *Ydir,int order)

{
  ChMesh *pCVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  undefined1 auVar7 [16];
  int iVar8;
  ChNodeFEAxyzrot *this_00;
  long lVar9;
  ChVector<double> *pCVar10;
  ChVector<double> *pCVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> hnode_i;
  ChVectorDynamic<> myknots;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  mynodes;
  ChMatrix33<double> mrot;
  vector<double,_std::allocator<double>_> my_el_knots;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  my_el_nodes;
  long local_2a0;
  ChVector<double> local_298;
  value_type local_278;
  ChVector<double> *local_268;
  ChVector<double> *local_260;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_258;
  shared_ptr<chrono::fea::ChMesh> *local_240;
  element_type *local_238;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_230;
  shared_ptr<chrono::fea::ChElementBase> local_228;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_218;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  local_208;
  ulong local_1e8;
  double local_1e0;
  ChBuilderBeamIGA *local_1d8;
  shared_ptr<chrono::fea::ChBeamSectionCosserat> *local_1d0;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  *local_1c8;
  vector<double,_std::allocator<double>_> local_1c0;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  local_1a8;
  ChMatrix33<double> local_190;
  ChFrame<double> local_148;
  ChFrame<double> local_b8;
  
  local_240 = mesh;
  local_1d0 = sect;
  std::
  vector<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
  ::clear(&this->beam_elems);
  local_1c8 = &this->beam_nodes;
  local_1d8 = this;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::clear(local_1c8);
  dVar30 = B->m_data[0] - A->m_data[0];
  auVar16 = vsubpd_avx(*(undefined1 (*) [16])(B->m_data + 1),*(undefined1 (*) [16])(A->m_data + 1));
  local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  uVar2 = vcmppd_avx512vl(auVar16,ZEXT816(0) << 0x40,0);
  if ((byte)((byte)(uVar2 & 3) & dVar30 == 0.0 & (byte)((uVar2 & 3) >> 1)) == 0) {
    dVar22 = auVar16._0_8_;
    auVar16 = vshufpd_avx(auVar16,auVar16,1);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar22 * dVar22;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar30;
    auVar15 = vfmadd231sd_fma(auVar17,auVar18,auVar18);
    auVar15 = vfmadd231sd_fma(auVar15,auVar16,auVar16);
    auVar15 = vsqrtsd_avx(auVar15,auVar15);
    bVar6 = 2.2250738585072014e-308 <= auVar15._0_8_;
    dVar26 = 1.0 / auVar15._0_8_;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = (ulong)bVar6 * (long)(auVar16._0_8_ * dVar26);
    local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         (double)((ulong)bVar6 * (long)(dVar22 * dVar26));
    auVar16._0_8_ = (ulong)bVar6 * (long)(dVar30 * dVar26) + (ulong)!bVar6 * 0x3ff0000000000000;
    auVar16._8_8_ = 0;
  }
  else {
    auVar16 = ZEXT816(0x3ff0000000000000);
    auVar15 = ZEXT816(0) << 0x40;
  }
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = Ydir->m_data[2];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = Ydir->m_data[0];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = Ydir->m_data[1];
  local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar16._0_8_;
  local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       auVar15._0_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       Ydir->m_data[2] *
       local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar17 = vfmsub231sd_fma(auVar27,auVar15,auVar36);
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       Ydir->m_data[1] *
       local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar18 = vfmsub231sd_fma(auVar23,auVar7,auVar31);
  local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar18._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       Ydir->m_data[0] *
       local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar19 = vfmsub231sd_fma(auVar19,auVar16,auVar34);
  local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       auVar19._0_8_;
  local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       auVar17._0_8_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar17 = vfmadd231sd_fma(auVar38,auVar18,auVar18);
  auVar17 = vfmadd231sd_fma(auVar17,auVar19,auVar19);
  auVar17 = vsqrtsd_avx(auVar17,auVar17);
  dVar30 = auVar17._0_8_;
  if (0.0001 <= dVar30) goto LAB_005e1d0c;
  auVar3._8_8_ = 0x7fffffffffffffff;
  auVar3._0_8_ = 0x7fffffffffffffff;
  auVar17 = vandpd_avx512vl(auVar36,auVar3);
  if (0.9 <= auVar17._0_8_) {
    auVar4._8_8_ = 0x7fffffffffffffff;
    auVar4._0_8_ = 0x7fffffffffffffff;
    auVar17 = vandpd_avx512vl(auVar34,auVar4);
    if (0.9 <= auVar17._0_8_) {
      auVar5._8_8_ = 0x7fffffffffffffff;
      auVar5._0_8_ = 0x7fffffffffffffff;
      auVar17 = vandpd_avx512vl(auVar31,auVar5);
      auVar18 = ZEXT816(0);
      if (0.9 <= auVar17._0_8_) goto LAB_005e1cd6;
      auVar17 = ZEXT816(0x3ff0000000000000);
    }
    else {
      auVar18 = ZEXT816(0x3ff0000000000000);
LAB_005e1cd6:
      auVar17 = ZEXT816(0);
    }
    auVar19 = ZEXT816(0);
  }
  else {
    auVar19 = ZEXT816(0x3ff0000000000000);
    auVar17 = ZEXT816(0);
    auVar18 = ZEXT816(0);
  }
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       auVar17._0_8_ *
       -local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar23 = vfmadd231sd_fma(auVar28,auVar15,auVar19);
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       auVar18._0_8_ *
       -local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar17 = vfmadd231sd_fma(auVar24,auVar7,auVar17);
  local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar17._0_8_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       auVar19._0_8_ *
       -local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar18 = vfmadd231sd_fma(auVar20,auVar16,auVar18);
  local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       auVar18._0_8_;
  local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       auVar23._0_8_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar17 = vfmadd231sd_fma(auVar32,auVar17,auVar17);
  auVar17 = vfmadd231sd_fma(auVar17,auVar18,auVar18);
  auVar17 = vsqrtsd_avx(auVar17,auVar17);
  dVar30 = auVar17._0_8_;
LAB_005e1d0c:
  iVar8 = order + N;
  dVar30 = 1.0 / dVar30;
  local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
       dVar30;
  local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] *
       dVar30;
  local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       dVar30;
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar15 = vfmsub231sd_fma(auVar33,auVar29,auVar15);
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] *
       local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar16 = vfmsub231sd_fma(auVar35,auVar21,auVar16);
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] *
       local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar17 = vfmsub231sd_fma(auVar37,auVar25,auVar7);
  local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       auVar15._0_8_;
  local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar16._0_8_;
  local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       auVar17._0_8_;
  local_258.m_storage.m_data = (double *)0x0;
  local_258.m_storage.m_rows = 0;
  local_268 = A;
  local_260 = B;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_258,(long)(order + 1 + iVar8));
  local_1e8 = (ulong)(uint)N;
  geometry::ChBasisToolsBspline::ComputeKnotUniformMultipleEnds
            ((ChVectorDynamic<> *)&local_258,order,0.0,1.0);
  local_208.
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208.
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (0 < iVar8) {
    iVar13 = 0;
    local_1e0 = (double)(iVar8 + -1);
    do {
      auVar16 = *(undefined1 (*) [16])local_268->m_data;
      dVar30 = (double)iVar13 / local_1e0;
      auVar15 = vsubpd_avx(*(undefined1 (*) [16])local_260->m_data,auVar16);
      local_298.m_data[2] =
           local_268->m_data[2] + dVar30 * (local_260->m_data[2] - local_268->m_data[2]);
      local_298.m_data[0] = auVar16._0_8_ + dVar30 * auVar15._0_8_;
      local_298.m_data[1] = auVar16._8_8_ + dVar30 * auVar15._8_8_;
      pCVar11 = &local_298;
      ChFrame<double>::ChFrame(&local_b8,pCVar11,&local_190);
      this_00 = (ChNodeFEAxyzrot *)
                ChFrame<double>::operator_new((ChFrame<double> *)0x2c8,(size_t)pCVar11);
      local_148._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
      local_148.coord.pos.m_data[0] = local_b8.coord.pos.m_data[0];
      local_148.coord.pos.m_data[1] = local_b8.coord.pos.m_data[1];
      local_148.coord.pos.m_data[2] = local_b8.coord.pos.m_data[2];
      local_148.coord.rot.m_data[0] = local_b8.coord.rot.m_data[0];
      local_148.coord.rot.m_data[1] = local_b8.coord.rot.m_data[1];
      local_148.coord.rot.m_data[2] = local_b8.coord.rot.m_data[2];
      local_148.coord.rot.m_data[3] = local_b8.coord.rot.m_data[3];
      local_148.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
      local_148.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      local_148.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_148.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      local_148.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      local_148.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
      local_148.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      local_148.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
      local_148.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
      ChNodeFEAxyzrot::ChNodeFEAxyzrot(this_00,&local_148);
      local_278.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = this_00;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::fea::ChNodeFEAxyzrot*>
                (&local_278.
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,this_00);
      pCVar1 = (local_240->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_218.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &(local_278.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->super_ChNodeFEAbase;
      local_218.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           local_278.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_278.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_278.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_278.
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_278.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_278.
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      ChMesh::AddNode(pCVar1,&local_218);
      if (local_218.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_218.
                   super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      ::push_back(&local_208,&local_278);
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      ::push_back(local_1c8,&local_278);
      if (local_278.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_278.
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      iVar13 = iVar13 + 1;
    } while (iVar8 != iVar13);
  }
  if (0 < (int)local_1e8) {
    local_260 = (ChVector<double> *)(local_1e8 & 0xffffffff);
    local_2a0 = 0;
    lVar12 = 0;
    pCVar11 = (ChVector<double> *)0x0;
    local_268 = (ChVector<double> *)(ulong)(order + 1);
    do {
      local_148.coord.pos.m_data[1] = 0.0;
      local_148._vptr_ChFrame = (_func_int **)0x0;
      local_148.coord.pos.m_data[0] = 0.0;
      if (order < 0) {
        local_b8._vptr_ChFrame = (_func_int **)0x0;
        local_b8.coord.pos.m_data[0] = 0.0;
        local_b8.coord.pos.m_data[1] = 0.0;
      }
      else {
        lVar9 = 0;
        lVar14 = lVar12;
        do {
          if (local_258.m_storage.m_rows <= (long)pCVar11->m_data + lVar9) {
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          if (local_148.coord.pos.m_data[0] == local_148.coord.pos.m_data[1]) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)&local_148,
                       (iterator)local_148.coord.pos.m_data[0],
                       (double *)((long)local_258.m_storage.m_data + lVar14));
          }
          else {
            *(double *)local_148.coord.pos.m_data[0] =
                 *(double *)((long)local_258.m_storage.m_data + lVar14);
            local_148.coord.pos.m_data[0] = (double)((long)local_148.coord.pos.m_data[0] + 8);
          }
          lVar9 = lVar9 + 1;
          lVar14 = lVar14 + 8;
        } while ((ulong)(~(order * 2 >> 0x1f) & order * 2 + 1U) + 1 != lVar9);
        local_b8.coord.pos.m_data[1] = 0.0;
        local_b8._vptr_ChFrame = (_func_int **)0x0;
        local_b8.coord.pos.m_data[0] = 0.0;
        pCVar10 = local_268;
        lVar14 = local_2a0;
        if (-1 < order) {
          do {
            std::
            vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ::push_back((vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                         *)&local_b8,
                        (value_type *)
                        ((long)&((local_208.
                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr + lVar14));
            lVar14 = lVar14 + 0x10;
            pCVar10 = (ChVector<double> *)((long)pCVar10[-1].m_data + 0x17);
          } while (pCVar10 != (ChVector<double> *)0x0);
        }
      }
      local_298.m_data[0] = 0.0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<chrono::fea::ChElementBeamIGA,std::allocator<chrono::fea::ChElementBeamIGA>>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_298.m_data + 1),
                 (ChElementBeamIGA **)&local_298,
                 (allocator<chrono::fea::ChElementBeamIGA> *)&local_278);
      dVar30 = local_298.m_data[0];
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      ::vector(&local_1a8,
               (vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                *)&local_b8);
      std::vector<double,_std::allocator<double>_>::vector
                (&local_1c0,(vector<double,_std::allocator<double>_> *)&local_148);
      (*(*(_func_int ***)dVar30)[0x1c])(dVar30,&local_1a8,&local_1c0,(ulong)(uint)order);
      if (local_1c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      ::~vector(&local_1a8);
      local_238 = (local_1d0->
                  super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
      local_230._M_pi =
           (local_1d0->
           super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if (local_230._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_230._M_pi)->_M_use_count = (local_230._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_230._M_pi)->_M_use_count = (local_230._M_pi)->_M_use_count + 1;
        }
      }
      ((element_type *)((long)local_298.m_data[0] + 0x188))->_vptr_ChElementBase =
           (_func_int **)local_238;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_298.m_data[0] + 400),
                 &local_230);
      if (local_230._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_230._M_pi);
      }
      pCVar1 = (local_240->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_228.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_298.m_data[0];
      local_228.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.m_data[1];
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.m_data[1] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)((long)local_298.m_data[1] + 8) =
               *(_Atomic_word *)((long)local_298.m_data[1] + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)((long)local_298.m_data[1] + 8) =
               *(_Atomic_word *)((long)local_298.m_data[1] + 8) + 1;
        }
      }
      ChMesh::AddElement(pCVar1,&local_228);
      if (local_228.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_228.
                   super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::
      vector<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
      ::push_back(&local_1d8->beam_elems,(value_type *)&local_298);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.m_data[1] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.m_data[1]);
      }
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      ::~vector((vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                 *)&local_b8);
      if (local_148._vptr_ChFrame != (_func_int **)0x0) {
        operator_delete(local_148._vptr_ChFrame,
                        (long)local_148.coord.pos.m_data[1] - (long)local_148._vptr_ChFrame);
      }
      local_2a0 = local_2a0 + 0x10;
      pCVar11 = (ChVector<double> *)((long)pCVar11->m_data + 1);
      lVar12 = lVar12 + 8;
    } while (pCVar11 != local_260);
  }
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::~vector(&local_208);
  if (local_258.m_storage.m_data != (double *)0x0) {
    free((void *)local_258.m_storage.m_data[-1]);
  }
  return;
}

Assistant:

void ChBuilderBeamIGA::BuildBeam(std::shared_ptr<ChMesh> mesh,                 // mesh to store the resulting elements
                                 std::shared_ptr<ChBeamSectionCosserat> sect,  // section material for beam elements
                                 const int N,                                  // number of elements in the segment
                                 const ChVector<> A,                           // starting point
                                 const ChVector<> B,                           // ending point
                                 const ChVector<> Ydir,                        // the 'up' Y direction of the beam
                                 const int order                               // the order of spline (default=3,cubic)
) {
    beam_elems.clear();
    beam_nodes.clear();

    // rotation of all nodes
    ChMatrix33<> mrot;
    mrot.Set_A_Xdir(B - A, Ydir);

    int p = order;

    // Create the 'complete' knot vector, with multiple at the ends
    ChVectorDynamic<> myknots(N + p + p + 1);
    geometry::ChBasisToolsBspline::ComputeKnotUniformMultipleEnds(myknots, p, 0.0, 1.0);

    // Create the 'complete' stl vector of control points, with uniform distribution
    std::vector<std::shared_ptr<ChNodeFEAxyzrot>> mynodes;
    for (int i_node = 0; i_node < N + p; ++i_node) {
        double abscyssa = ((double)i_node / (double)(N + p - 1));

        // position of node
        ChVector<> pos = A + (B - A) * abscyssa;

        auto hnode_i = chrono_types::make_shared<ChNodeFEAxyzrot>(ChFrame<>(pos, mrot));
        mesh->AddNode(hnode_i);
        mynodes.push_back(hnode_i);
        this->beam_nodes.push_back(hnode_i);
    }

    // Create the single elements by picking a subset of the nodes and control points
    for (int i_el = 0; i_el < N; ++i_el) {
        std::vector<double> my_el_knots;
        for (int i_el_knot = 0; i_el_knot < p + p + 1 + 1; ++i_el_knot) {
            my_el_knots.push_back(myknots(i_el + i_el_knot));
        }

        std::vector<std::shared_ptr<ChNodeFEAxyzrot>> my_el_nodes;
        for (int i_el_node = 0; i_el_node < p + 1; ++i_el_node) {
            my_el_nodes.push_back(mynodes[i_el + i_el_node]);
        }

        auto belement_i = chrono_types::make_shared<ChElementBeamIGA>();
        belement_i->SetNodesGenericOrder(my_el_nodes, my_el_knots, p);
        belement_i->SetSection(sect);
        mesh->AddElement(belement_i);
        this->beam_elems.push_back(belement_i);
    }
}